

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<double>::SolveCG
          (TPZMatrix<double> *this,int64_t *numiterations,TPZSolver *preconditioner,
          TPZFMatrix<double> *F,TPZFMatrix<double> *result,TPZFMatrix<double> *residual,REAL *tol,
          int FromCurrent)

{
  long lVar1;
  undefined8 in_RDX;
  TPZMatrixSolver<double> *precond;
  int64_t *in_stack_00000290;
  TPZFMatrix<double> *in_stack_00000298;
  TPZMatrixSolver<double> *in_stack_000002a0;
  TPZFMatrix<double> *in_stack_000002a8;
  TPZFMatrix<double> *in_stack_000002b0;
  TPZMatrix<double> *in_stack_000002b8;
  double *in_stack_000002d0;
  int in_stack_000002d8;
  
  lVar1 = __dynamic_cast(in_RDX,&TPZSolver::typeinfo,&TPZMatrixSolver<double>::typeinfo,0);
  if (lVar1 == 0) {
    __cxa_bad_cast();
  }
  CG<TPZMatrix<double>,TPZFMatrix<double>,TPZMatrixSolver<double>,double>
            (in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,
             in_stack_00000298,in_stack_00000290,in_stack_000002d0,in_stack_000002d8);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveCG(int64_t &numiterations, TPZSolver &preconditioner,
						const	TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
						TPZFMatrix<TVar> *residual, REAL &tol, const int FromCurrent) {
    if constexpr(std::is_floating_point<TVar>::value){
        TPZMatrixSolver<TVar> &precond = dynamic_cast<TPZMatrixSolver<TVar> &>(preconditioner);
        CG(*this, result, F, precond, residual, numiterations, tol, FromCurrent);
    }else{
        PZError<<__PRETTY_FUNCTION__<<" is currently not implemented ";
        PZError<<"for this type\nAborting...";
        DebugStop();
    }
}